

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

Token * errorToken(char *message)

{
  size_t sVar1;
  char *in_RSI;
  Token *in_RDI;
  Token *token;
  
  in_RDI->type = TOKEN_ERROR;
  in_RDI->start = in_RSI;
  sVar1 = strlen(in_RSI);
  in_RDI->length = (int)sVar1;
  in_RDI->line = scanner.line;
  return in_RDI;
}

Assistant:

static Token errorToken(const char *message) {
    Token token;
    token.type = TOKEN_ERROR;
    token.start = message;
    token.length = (int) strlen(message);
    token.line = scanner.line;

    return token;
}